

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

Node * __thiscall
MeCab::anon_unknown_0::TaggerImpl::parseToNode(TaggerImpl *this,char *str,size_t len)

{
  uint uVar1;
  int iVar2;
  Lattice *pLVar3;
  undefined4 extraout_var;
  undefined8 in_RDX;
  undefined8 in_RSI;
  TaggerImpl *in_RDI;
  Lattice *lattice;
  char *in_stack_ffffffffffffffc8;
  Node *local_8;
  
  pLVar3 = mutable_lattice(in_RDI);
  (*pLVar3->_vptr_Lattice[10])(pLVar3,in_RSI,in_RDX);
  initRequestType(in_RDI);
  uVar1 = (**(in_RDI->super_Tagger)._vptr_Tagger)(in_RDI,pLVar3);
  if ((uVar1 & 1) == 0) {
    (*pLVar3->_vptr_Lattice[0x24])();
    set_what(in_RDI,in_stack_ffffffffffffffc8);
    local_8 = (Node *)0x0;
  }
  else {
    iVar2 = (*pLVar3->_vptr_Lattice[2])();
    local_8 = (Node *)CONCAT44(extraout_var,iVar2);
  }
  return local_8;
}

Assistant:

const Node *TaggerImpl::parseToNode(const char *str, size_t len) {
  Lattice *lattice = mutable_lattice();
  lattice->set_sentence(str, len);
  initRequestType();
  if (!parse(lattice)) {
    set_what(lattice->what());
    return 0;
  }
  return lattice->bos_node();
}